

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::MILSpec::TensorValue::_InternalParse
          (TensorValue *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  TensorValue_RepeatedStrings *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar2;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = ptr;
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) {
      return local_48;
    }
    local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
    tag_00 = local_3c;
    cVar2 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar2 != '\n') break;
      msg = (TensorValue_RepeatedStrings *)_internal_mutable_floats(this);
LAB_001b12b7:
      local_48 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg->super_MessageLite,local_48);
      goto LAB_001b12c6;
    case 2:
      if (cVar2 == '\x12') {
        msg = (TensorValue_RepeatedStrings *)_internal_mutable_ints(this);
        goto LAB_001b12b7;
      }
      break;
    case 3:
      if (cVar2 == '\x1a') {
        msg = (TensorValue_RepeatedStrings *)_internal_mutable_bools(this);
        goto LAB_001b12b7;
      }
      break;
    case 4:
      if (cVar2 == '\"') {
        msg = _internal_mutable_strings(this);
        goto LAB_001b12b7;
      }
      break;
    case 5:
      if (cVar2 == '*') {
        msg = (TensorValue_RepeatedStrings *)_internal_mutable_longints(this);
        goto LAB_001b12b7;
      }
      break;
    case 6:
      if (cVar2 == '2') {
        msg = (TensorValue_RepeatedStrings *)_internal_mutable_doubles(this);
        goto LAB_001b12b7;
      }
      break;
    case 7:
      if (cVar2 == ':') {
        msg = (TensorValue_RepeatedStrings *)_internal_mutable_bytes(this);
        goto LAB_001b12b7;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_48 == (char *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return local_48;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
LAB_001b12c6:
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* TensorValue::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_floats(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_ints(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_bools(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_strings(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_longints(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 50)) {
          ptr = ctx->ParseMessage(_internal_mutable_doubles(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_bytes(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}